

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask16_24(uint32_t *in,uint32_t *out)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x3830282018100800));
  puVar1 = out + 0xc;
  auVar4 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (long)puVar1));
  vpmovsxbd_avx2(ZEXT816(0x3c342c241c140c04));
  auVar5 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (long)puVar1));
  auVar5 = vpslld_avx2(auVar5,0x10);
  auVar4 = vpor_avx2(auVar5,auVar4);
  *(undefined1 (*) [32])out = auVar4;
  vpmovsxbd_avx(ZEXT416(0x58504840));
  auVar2 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (long)puVar1));
  vpmovsxbd_avx(ZEXT416(0x5c544c44));
  auVar3 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (long)puVar1));
  auVar3 = vpslld_avx(auVar3,0x10);
  auVar2 = vpor_avx(auVar3,auVar2);
  *(undefined1 (*) [16])(out + 8) = auVar2;
  return puVar1;
}

Assistant:

uint32_t *__fastpackwithoutmask16_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;

  return out;
}